

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufBuildDecTable(longlong *hcode,int im,int iM,HufDec *hdecod)

{
  undefined1 auVar1 [16];
  uint uVar2;
  longlong lVar3;
  longlong lVar4;
  uint *puVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  longlong i_1;
  HufDec *pl_1;
  int i;
  int *p;
  HufDec *pl;
  int l;
  longlong c;
  long local_58;
  uint *local_50;
  int local_44;
  int local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (in_EDX < local_14) {
      return true;
    }
    lVar3 = hufCode(*(longlong *)(in_RDI + (long)local_14 * 8));
    lVar4 = hufLength(*(longlong *)(in_RDI + (long)local_14 * 8));
    uVar2 = (uint)lVar4;
    bVar9 = (byte)lVar4;
    if (lVar3 >> (bVar9 & 0x3f) != 0) break;
    if ((int)uVar2 < 0xf) {
      if (uVar2 != 0) {
        local_50 = (uint *)(in_RCX + (lVar3 << (0xe - bVar9 & 0x3f)) * 0x10);
        for (local_58 = 1L << (0xe - bVar9 & 0x3f); 0 < local_58; local_58 = local_58 + -1) {
          if (((char)*local_50 != '\0') || (*(long *)(local_50 + 2) != 0)) {
            return false;
          }
          *local_50 = *local_50 & 0xffffff00 | uVar2 & 0xff;
          *local_50 = *local_50 & 0xff | local_14 << 8;
          local_50 = local_50 + 4;
        }
      }
    }
    else {
      puVar5 = (uint *)(in_RCX + (lVar3 >> (bVar9 - 0xe & 0x3f)) * 0x10);
      if ((char)*puVar5 != '\0') {
        return false;
      }
      *puVar5 = *puVar5 & 0xff | (((int)*puVar5 >> 8) + 1) * 0x100;
      if (*(long *)(puVar5 + 2) == 0) {
        pvVar8 = operator_new__(4);
        *(void **)(puVar5 + 2) = pvVar8;
      }
      else {
        pvVar8 = *(void **)(puVar5 + 2);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)((int)*puVar5 >> 8);
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar6);
        *(void **)(puVar5 + 2) = pvVar7;
        for (local_44 = 0; local_44 < ((int)*puVar5 >> 8) + -1; local_44 = local_44 + 1) {
          *(undefined4 *)(*(long *)(puVar5 + 2) + (long)local_44 * 4) =
               *(undefined4 *)((long)pvVar8 + (long)local_44 * 4);
        }
        if (pvVar8 != (void *)0x0) {
          operator_delete__(pvVar8);
        }
      }
      *(int *)(*(long *)(puVar5 + 2) + (long)(((int)*puVar5 >> 8) + -1) * 4) = local_14;
    }
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool hufBuildDecTable(const long long *hcode,  // i : encoding table
                      int im,                  // i : min index in hcode
                      int iM,                  // i : max index in hcode
                      HufDec *hdecod)          //  o: (allocated by caller)
//     decoding table [HUF_DECSIZE]
{
  //
  // Init hashtable & loop on all codes.
  // Assumes that hufClearDecTable(hdecod) has already been called.
  //

  for (; im <= iM; im++) {
    long long c = hufCode(hcode[im]);
    int l = hufLength(hcode[im]);

    if (c >> l) {
      //
      // Error: c is supposed to be an l-bit code,
      // but c contains a value that is greater
      // than the largest l-bit number.
      //

      // invalidTableEntry();
      return false;
    }

    if (l > HUF_DECBITS) {
      //
      // Long code: add a secondary entry
      //

      HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

      if (pl->len) {
        //
        // Error: a short code has already
        // been stored in table entry *pl.
        //

        // invalidTableEntry();
        return false;
      }

      pl->lit++;

      if (pl->p) {
        int *p = pl->p;
        pl->p = new int[pl->lit];

        for (int i = 0; i < pl->lit - 1; ++i) pl->p[i] = p[i];

        delete[] p;
      } else {
        pl->p = new int[1];
      }

      pl->p[pl->lit - 1] = im;
    } else if (l) {
      //
      // Short code: init all primary entries
      //

      HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

      for (long long i = 1ULL << (HUF_DECBITS - l); i > 0; i--, pl++) {
        if (pl->len || pl->p) {
          //
          // Error: a short code or a long code has
          // already been stored in table entry *pl.
          //

          // invalidTableEntry();
          return false;
        }

        pl->len = l;
        pl->lit = im;
      }
    }
  }

  return true;
}